

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void __thiscall QGuiApplicationPrivate::notifyWindowIconChanged(QGuiApplicationPrivate *this)

{
  long i_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  long in_FS_OFFSET;
  int i;
  QWindowList list;
  QEvent ev;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  QList<QWindow_*> local_30;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_18,ApplicationWindowIconChange);
  local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  iVar3 = 0;
  while( true ) {
    i_00 = (long)iVar3;
    qVar1 = QList<QWindow_*>::size(&local_30);
    if (qVar1 <= i_00) break;
    ppQVar2 = QList<QWindow_*>::at
                        ((QList<QWindow_*> *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),i_00);
    QCoreApplication::sendEvent((QObject *)*ppQVar2,(QEvent *)&local_18);
    iVar3 = iVar3 + 1;
  }
  QList<QWindow_*>::~QList((QList<QWindow_*> *)0x36d65a);
  QEvent::~QEvent((QEvent *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::notifyWindowIconChanged()
{
    QEvent ev(QEvent::ApplicationWindowIconChange);
    const QWindowList list = QGuiApplication::topLevelWindows();
    for (int i = 0; i < list.size(); ++i)
        QCoreApplication::sendEvent(list.at(i), &ev);
}